

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O3

void __thiscall CVmImageLoader::save_synth_exports(CVmImageLoader *this,CVmFile *fp)

{
  long lVar1;
  long lVar2;
  uint32_t tmp;
  long lVar3;
  long lVar4;
  char b [4];
  synth_save_cb_ctx ctx;
  undefined4 local_3c;
  CVmFile *local_38;
  undefined8 local_30;
  
  local_30 = 0;
  local_38 = fp;
  lVar3 = ftell((FILE *)fp->fp_);
  lVar1 = fp->seek_base_;
  local_3c = 0;
  CVmFile::write_bytes(fp,(char *)&local_3c,4);
  CVmHashTable::enum_entries(this->synth_exports_,save_synth_export_cb,&local_38);
  lVar4 = ftell((FILE *)fp->fp_);
  lVar2 = fp->seek_base_;
  fseek((FILE *)fp->fp_,(lVar3 - lVar1) + lVar2,0);
  local_3c = (undefined4)local_30;
  CVmFile::write_bytes(fp,(char *)&local_3c,4);
  fseek((FILE *)fp->fp_,(lVar4 - lVar2) + fp->seek_base_,0);
  return;
}

Assistant:

void CVmImageLoader::save_synth_exports(VMG_ CVmFile *fp)
{
    synth_save_cb_ctx ctx;
    long pos;
    long end_pos;

    /* set up our context */
    ctx.fp = fp;
    ctx.cnt = 0;

    /* 
     *   write a placeholder count of zero, but remember where it is so we
     *   can come back and fix it up later 
     */
    pos = fp->get_pos();
    fp->write_uint4(0);

    /* enumerate all of the entries through our save callback */
    synth_exports_->enum_entries(&save_synth_export_cb, &ctx);

    /* go back and fix up the count, then seek back to the end */
    end_pos = fp->get_pos();
    fp->set_pos(pos);
    fp->write_uint4(ctx.cnt);
    fp->set_pos(end_pos);
}